

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void de::cmdline::detail::TypedFieldValueTraits<std::vector<int,_std::allocator<int>_>_>::destroy
               (void *value)

{
  void *value_local;
  
  if (value != (void *)0x0) {
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)value);
    operator_delete(value,0x18);
  }
  return;
}

Assistant:

static void destroy (void* value) { delete (Value*)value; }